

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

void __thiscall AngleSet::computeStartEndTheta(AngleSet *this,double *sTheta,double *eTheta)

{
  AngleSetArc *pAVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar3 = this->head;
  pAVar1 = this->angles + iVar3;
  uVar5 = (ulong)this->angles[iVar3].next;
  if ((long)uVar5 < 0) {
    *sTheta = pAVar1->sTheta;
    dVar7 = this->angles[iVar3].eTheta;
  }
  else {
    dVar7 = pAVar1->eTheta;
    dVar8 = this->angles[uVar5].sTheta;
    dVar9 = dVar8 - dVar7;
    while( true ) {
      dVar4 = dVar9;
      uVar6 = uVar5 & 0xffffffff;
      uVar5 = (ulong)this->angles[uVar6].next;
      dVar2 = this->angles[uVar6].eTheta;
      if ((long)uVar5 < 0) break;
      dVar10 = this->angles[uVar5].sTheta;
      dVar9 = dVar10 - dVar2;
      if (dVar9 <= dVar4) {
        dVar10 = dVar8;
      }
      dVar7 = (double)(~-(ulong)(dVar4 < dVar9) & (ulong)dVar7 |
                      (ulong)dVar2 & -(ulong)(dVar4 < dVar9));
      dVar8 = dVar10;
      if (dVar9 <= dVar4) {
        dVar9 = dVar4;
      }
    }
    dVar10 = (6.283185307179586 - dVar2) + pAVar1->sTheta;
    uVar5 = -(ulong)(dVar4 < dVar10);
    dVar7 = (double)(~uVar5 & (ulong)dVar7 | (ulong)dVar2 & uVar5);
    dVar9 = pAVar1->sTheta;
    if (dVar10 <= dVar4) {
      dVar9 = dVar8;
    }
    *sTheta = dVar9;
  }
  *eTheta = dVar7;
  return;
}

Assistant:

void AngleSet::computeStartEndTheta(double & sTheta, double & eTheta)
{
	// Special case: Just one arc
	if (angles[head].next < 0) {
		sTheta = angles[head].sTheta;
		eTheta = angles[head].eTheta;

		return;
	} //end-if

	  // OK. More than one arc. Find the biggest gap
	int current = head;
	int nextArc = angles[current].next;

	double biggestGapSTheta = angles[current].eTheta;
	double biggestGapEtheta = angles[nextArc].sTheta;
	double biggestGapLength = biggestGapEtheta - biggestGapSTheta;

	double start, end, len;
	while (1) {
		current = nextArc;
		nextArc = angles[nextArc].next;
		if (nextArc < 0) break;

		start = angles[current].eTheta;
		end = angles[nextArc].sTheta;
		len = end - start;

		if (len > biggestGapLength) {
			biggestGapSTheta = start;
			biggestGapEtheta = end;
			biggestGapLength = len;
		} //end-if

	} //end-while

	  // Compute the gap between the last arc & the first arc
	start = angles[current].eTheta;
	end = angles[head].sTheta;
	len = TWOPI - start + end;
	if (len > biggestGapLength) {
		biggestGapSTheta = start;
		biggestGapEtheta = end;
	} //end-if

	sTheta = biggestGapEtheta;
	eTheta = biggestGapSTheta;
}